

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

void __thiscall
Json::BuiltStyledStreamWriter::writeArrayValue(BuiltStyledStreamWriter *this,Value *value)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  byte bVar4;
  ArrayIndex AVar5;
  undefined4 extraout_var;
  Value *root;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  String local_60;
  ulong local_40;
  Value *local_38;
  
  local_38 = value;
  AVar5 = Value::size(value);
  local_40 = CONCAT44(extraout_var,AVar5);
  if (AVar5 == 0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"[]","");
    pushValue(this,&local_60);
  }
  else {
    if (this->cs_ != All) {
      bVar3 = isMultilineArray(this,local_38);
      if (!bVar3) {
        uVar7 = local_40 & 0xffffffff;
        if ((long)(this->childValues_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->childValues_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5 == uVar7) {
          std::__ostream_insert<char,std::char_traits<char>>((this->super_StreamWriter).sout_,"[",1)
          ;
          if ((this->indentation_)._M_string_length != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->super_StreamWriter).sout_," ",1);
          }
          lVar8 = 0;
          do {
            if (lVar8 != 0) {
              bVar3 = (this->indentation_)._M_string_length != 0;
              pcVar6 = ", ";
              if (!bVar3) {
                pcVar6 = ",";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_StreamWriter).sout_,pcVar6,(ulong)bVar3 + 1);
            }
            pbVar1 = (this->childValues_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->super_StreamWriter).sout_,
                       *(char **)((long)&(pbVar1->_M_dataplus)._M_p + lVar8),
                       *(long *)((long)&pbVar1->_M_string_length + lVar8));
            lVar8 = lVar8 + 0x20;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
          if ((this->indentation_)._M_string_length != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->super_StreamWriter).sout_," ",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((this->super_StreamWriter).sout_,"]",1)
          ;
          return;
        }
        __assert_fail("childValues_.size() == size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                      ,0x40e,"void Json::BuiltStyledStreamWriter::writeArrayValue(const Value &)");
      }
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"[","");
    writeWithIndent(this,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append
              ((char *)&this->indentString_,(ulong)(this->indentation_)._M_dataplus._M_p);
    pbVar1 = (this->childValues_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->childValues_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_40 = (ulong)((int)local_40 - 1);
    lVar8 = 0;
    uVar7 = 0;
    while( true ) {
      root = Value::operator[](local_38,(ArrayIndex)uVar7);
      writeCommentBeforeValue(this,root);
      if (pbVar1 == pbVar2) {
        bVar4 = this->field_0xd8;
        if ((bVar4 & 2) == 0) {
          writeIndent(this);
          bVar4 = this->field_0xd8;
        }
        this->field_0xd8 = bVar4 | 2;
        writeValue(this,root);
        this->field_0xd8 = this->field_0xd8 & 0xfd;
      }
      else {
        writeWithIndent(this,(String *)
                             ((long)&(((this->childValues_).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar8));
      }
      if (local_40 == uVar7) break;
      uVar7 = uVar7 + 1;
      std::__ostream_insert<char,std::char_traits<char>>((this->super_StreamWriter).sout_,",",1);
      writeCommentAfterValueOnSameLine(this,root);
      lVar8 = lVar8 + 0x20;
    }
    writeCommentAfterValueOnSameLine(this,root);
    unindent(this);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"]","");
    writeWithIndent(this,&local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeArrayValue(Value const& value) {
  unsigned size = value.size();
  if (size == 0)
    pushValue("[]");
  else {
    bool isMultiLine = (cs_ == CommentStyle::All) || isMultilineArray(value);
    if (isMultiLine) {
      writeWithIndent("[");
      indent();
      bool hasChildValue = !childValues_.empty();
      unsigned index = 0;
      for (;;) {
        Value const& childValue = value[index];
        writeCommentBeforeValue(childValue);
        if (hasChildValue)
          writeWithIndent(childValues_[index]);
        else {
          if (!indented_)
            writeIndent();
          indented_ = true;
          writeValue(childValue);
          indented_ = false;
        }
        if (++index == size) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *sout_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("]");
    } else // output on a single line
    {
      assert(childValues_.size() == size);
      *sout_ << "[";
      if (!indentation_.empty())
        *sout_ << " ";
      for (unsigned index = 0; index < size; ++index) {
        if (index > 0)
          *sout_ << ((!indentation_.empty()) ? ", " : ",");
        *sout_ << childValues_[index];
      }
      if (!indentation_.empty())
        *sout_ << " ";
      *sout_ << "]";
    }
  }
}